

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

ElementsDecodeRawTransactionResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::ElementsDecodeRawTransactionRequestStruct,cfd::js::api::ElementsDecodeRawTransactionResponseStruct>
          (ElementsDecodeRawTransactionResponseStruct *__return_storage_ptr__,api *this,
          ElementsDecodeRawTransactionRequestStruct *request,
          function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  ElementsDecodeRawTransactionResponseStruct local_1b0;
  undefined1 local_29;
  function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
  *local_28;
  string *fuction_name_local;
  function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
  *call_function_local;
  ElementsDecodeRawTransactionRequestStruct *request_local;
  ElementsDecodeRawTransactionResponseStruct *response;
  
  local_29 = 0;
  local_28 = call_function;
  fuction_name_local = &request->hex;
  call_function_local =
       (function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
        *)this;
  request_local = (ElementsDecodeRawTransactionRequestStruct *)__return_storage_ptr__;
  ElementsDecodeRawTransactionResponseStruct::ElementsDecodeRawTransactionResponseStruct
            (__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
  ::operator()(&local_1b0,
               (function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
                *)request,(ElementsDecodeRawTransactionRequestStruct *)call_function_local);
  ElementsDecodeRawTransactionResponseStruct::operator=(__return_storage_ptr__,&local_1b0);
  ElementsDecodeRawTransactionResponseStruct::~ElementsDecodeRawTransactionResponseStruct
            (&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}